

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::InstanceIntersectorK<8>_>,_false>
     ::occludedCoherent(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  ulong *puVar1;
  float *pfVar2;
  undefined4 uVar3;
  long lVar4;
  undefined1 auVar5 [32];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar26;
  Primitive *prim;
  undefined4 uVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong *puVar36;
  ulong *puVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 in_ZMM0 [64];
  vint4 bi;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar57 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  vint4 ai;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [64];
  Precalculations pre;
  vbool<8> valid0;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1301;
  undefined1 local_1300 [32];
  RayK<8> *local_12e0;
  AccelData *local_12d8;
  ulong local_12d0;
  RayK<8> *local_12c8;
  RayQueryContext *local_12c0;
  Primitive *local_12b8;
  ulong local_12b0;
  ulong local_12a8;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_1240;
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [8];
  float fStack_11b8;
  float fStack_11b4;
  undefined1 local_11b0 [8];
  float fStack_11a8;
  float fStack_11a4;
  undefined1 local_11a0 [16];
  undefined1 local_1190 [8];
  float fStack_1188;
  float fStack_1184;
  undefined1 local_1180 [16];
  undefined1 local_1170 [8];
  float fStack_1168;
  float fStack_1164;
  undefined1 local_1160 [16];
  undefined1 local_1150 [8];
  float fStack_1148;
  float fStack_1144;
  undefined1 local_1140 [16];
  undefined1 local_1130 [8];
  float fStack_1128;
  float fStack_1124;
  undefined1 local_1120 [32];
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_fc0;
  ulong local_fa0 [494];
  undefined1 auVar52 [28];
  undefined1 auVar61 [28];
  undefined1 auVar81 [64];
  
  auVar39 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar41 = vpcmpeqd_avx(auVar39,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
  auVar48 = vpcmpeqd_avx(auVar39,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
  auVar41 = vpackssdw_avx(auVar41,auVar48);
  if ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar41 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar41 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar41 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar41 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar41 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar41 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar41 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar41 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar41 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar41 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar41 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar41[0xf]) {
    return;
  }
  auVar48 = vpacksswb_avx(auVar41,auVar41);
  local_12d8 = This->ptr;
  local_1060 = *(undefined8 *)ray;
  uStack_1058 = *(undefined8 *)(ray + 8);
  uStack_1050 = *(undefined8 *)(ray + 0x10);
  uStack_1048 = *(undefined8 *)(ray + 0x18);
  local_1080 = *(undefined8 *)(ray + 0x20);
  uStack_1078 = *(undefined8 *)(ray + 0x28);
  uStack_1070 = *(undefined8 *)(ray + 0x30);
  uStack_1068 = *(undefined8 *)(ray + 0x38);
  auVar46 = *(undefined1 (*) [32])(ray + 0x80);
  auVar72._8_4_ = 0x7fffffff;
  auVar72._0_8_ = 0x7fffffff7fffffff;
  auVar72._12_4_ = 0x7fffffff;
  auVar72._16_4_ = 0x7fffffff;
  auVar72._20_4_ = 0x7fffffff;
  auVar72._24_4_ = 0x7fffffff;
  auVar72._28_4_ = 0x7fffffff;
  auVar47 = vandps_avx(auVar46,auVar72);
  auVar74._8_4_ = 0x219392ef;
  auVar74._0_8_ = 0x219392ef219392ef;
  auVar74._12_4_ = 0x219392ef;
  auVar74._16_4_ = 0x219392ef;
  auVar74._20_4_ = 0x219392ef;
  auVar74._24_4_ = 0x219392ef;
  auVar74._28_4_ = 0x219392ef;
  auVar47 = vcmpps_avx(auVar47,auVar74,1);
  auVar73 = vblendvps_avx(auVar46,auVar74,auVar47);
  auVar47 = *(undefined1 (*) [32])(ray + 0xa0);
  auVar5 = vandps_avx(auVar47,auVar72);
  auVar5 = vcmpps_avx(auVar5,auVar74,1);
  auVar54 = vblendvps_avx(auVar47,auVar74,auVar5);
  auVar5 = *(undefined1 (*) [32])(ray + 0xc0);
  auVar53 = vandps_avx(auVar5,auVar72);
  auVar53 = vcmpps_avx(auVar53,auVar74,1);
  auVar53 = vblendvps_avx(auVar5,auVar74,auVar53);
  local_10a0 = *(undefined8 *)(ray + 0x40);
  uStack_1098 = *(undefined8 *)(ray + 0x48);
  uStack_1090 = *(undefined8 *)(ray + 0x50);
  uStack_1088 = *(undefined8 *)(ray + 0x58);
  auVar13 = vrcpps_avx(auVar73);
  fVar6 = auVar13._0_4_;
  fVar7 = auVar13._4_4_;
  auVar14._4_4_ = auVar73._4_4_ * fVar7;
  auVar14._0_4_ = auVar73._0_4_ * fVar6;
  fVar8 = auVar13._8_4_;
  auVar14._8_4_ = auVar73._8_4_ * fVar8;
  fVar9 = auVar13._12_4_;
  auVar14._12_4_ = auVar73._12_4_ * fVar9;
  fVar10 = auVar13._16_4_;
  auVar14._16_4_ = auVar73._16_4_ * fVar10;
  fVar11 = auVar13._20_4_;
  auVar14._20_4_ = auVar73._20_4_ * fVar11;
  fVar12 = auVar13._24_4_;
  auVar14._24_4_ = auVar73._24_4_ * fVar12;
  auVar14._28_4_ = auVar73._28_4_;
  auVar79._8_4_ = 0x3f800000;
  auVar79._0_8_ = 0x3f8000003f800000;
  auVar79._12_4_ = 0x3f800000;
  auVar79._16_4_ = 0x3f800000;
  auVar79._20_4_ = 0x3f800000;
  auVar79._24_4_ = 0x3f800000;
  auVar79._28_4_ = 0x3f800000;
  auVar14 = vsubps_avx(auVar79,auVar14);
  auVar73 = vrcpps_avx(auVar54);
  fStack_10a4 = auVar13._28_4_ + auVar14._28_4_;
  local_10c0 = fVar6 + fVar6 * auVar14._0_4_;
  fStack_10bc = fVar7 + fVar7 * auVar14._4_4_;
  fStack_10b8 = fVar8 + fVar8 * auVar14._8_4_;
  fStack_10b4 = fVar9 + fVar9 * auVar14._12_4_;
  fStack_10b0 = fVar10 + fVar10 * auVar14._16_4_;
  fStack_10ac = fVar11 + fVar11 * auVar14._20_4_;
  fStack_10a8 = fVar12 + fVar12 * auVar14._24_4_;
  fVar6 = auVar73._0_4_;
  fVar7 = auVar73._4_4_;
  auVar13._4_4_ = auVar54._4_4_ * fVar7;
  auVar13._0_4_ = auVar54._0_4_ * fVar6;
  fVar8 = auVar73._8_4_;
  auVar13._8_4_ = auVar54._8_4_ * fVar8;
  fVar9 = auVar73._12_4_;
  auVar13._12_4_ = auVar54._12_4_ * fVar9;
  fVar10 = auVar73._16_4_;
  auVar13._16_4_ = auVar54._16_4_ * fVar10;
  fVar11 = auVar73._20_4_;
  auVar13._20_4_ = auVar54._20_4_ * fVar11;
  fVar12 = auVar73._24_4_;
  auVar13._24_4_ = auVar54._24_4_ * fVar12;
  auVar13._28_4_ = fStack_10a4;
  auVar13 = vsubps_avx(auVar79,auVar13);
  auVar54 = vrcpps_avx(auVar53);
  local_10e0 = fVar6 + fVar6 * auVar13._0_4_;
  fStack_10dc = fVar7 + fVar7 * auVar13._4_4_;
  fStack_10d8 = fVar8 + fVar8 * auVar13._8_4_;
  fStack_10d4 = fVar9 + fVar9 * auVar13._12_4_;
  fStack_10d0 = fVar10 + fVar10 * auVar13._16_4_;
  fStack_10cc = fVar11 + fVar11 * auVar13._20_4_;
  fStack_10c8 = fVar12 + fVar12 * auVar13._24_4_;
  fStack_10c4 = auVar73._28_4_ + auVar13._28_4_;
  fVar6 = auVar54._0_4_;
  fVar7 = auVar54._4_4_;
  auVar73._4_4_ = auVar53._4_4_ * fVar7;
  auVar73._0_4_ = auVar53._0_4_ * fVar6;
  fVar8 = auVar54._8_4_;
  auVar73._8_4_ = auVar53._8_4_ * fVar8;
  fVar9 = auVar54._12_4_;
  auVar73._12_4_ = auVar53._12_4_ * fVar9;
  fVar10 = auVar54._16_4_;
  auVar73._16_4_ = auVar53._16_4_ * fVar10;
  fVar11 = auVar54._20_4_;
  auVar73._20_4_ = auVar53._20_4_ * fVar11;
  fVar12 = auVar54._24_4_;
  auVar73._24_4_ = auVar53._24_4_ * fVar12;
  auVar73._28_4_ = auVar53._28_4_;
  auVar53 = vsubps_avx(auVar79,auVar73);
  local_1100 = fVar6 + fVar6 * auVar53._0_4_;
  fStack_10fc = fVar7 + fVar7 * auVar53._4_4_;
  fStack_10f8 = fVar8 + fVar8 * auVar53._8_4_;
  fStack_10f4 = fVar9 + fVar9 * auVar53._12_4_;
  fStack_10f0 = fVar10 + fVar10 * auVar53._16_4_;
  fStack_10ec = fVar11 + fVar11 * auVar53._20_4_;
  fStack_10e8 = fVar12 + fVar12 * auVar53._24_4_;
  fStack_10e4 = auVar54._28_4_ + auVar53._28_4_;
  auVar53 = ZEXT1232(ZEXT412(0)) << 0x20;
  local_1000 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar53);
  local_12e0 = ray + 0x100;
  local_1020 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar53);
  auVar49 = vpmovsxwd_avx(auVar41);
  local_1210 = vpunpckhwd_avx(auVar41,auVar41);
  auVar41 = auVar41 ^ auVar39;
  auVar39 = vpmovsxwd_avx(auVar41);
  auVar41 = vpunpckhwd_avx(auVar41,auVar41);
  local_1300._16_16_ = auVar41;
  local_1300._0_16_ = auVar39;
  auVar73 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar46 = vcmpps_avx(auVar46,auVar73,1);
  auVar53._8_4_ = 1;
  auVar53._0_8_ = 0x100000001;
  auVar53._12_4_ = 1;
  auVar53._16_4_ = 1;
  auVar53._20_4_ = 1;
  auVar53._24_4_ = 1;
  auVar53._28_4_ = 1;
  auVar46 = vandps_avx(auVar46,auVar53);
  auVar47 = vcmpps_avx(auVar47,auVar73,1);
  auVar62._8_4_ = 2;
  auVar62._0_8_ = 0x200000002;
  auVar62._12_4_ = 2;
  auVar62._16_4_ = 2;
  auVar62._20_4_ = 2;
  auVar62._24_4_ = 2;
  auVar62._28_4_ = 2;
  auVar47 = vandps_avx(auVar47,auVar62);
  local_1040 = ZEXT1632(auVar49);
  auVar63._16_16_ = local_1210;
  auVar63._0_16_ = auVar49;
  auVar47 = vorps_avx(auVar47,auVar46);
  auVar54._8_4_ = 4;
  auVar54._0_8_ = 0x400000004;
  auVar54._12_4_ = 4;
  auVar54._16_4_ = 4;
  auVar54._20_4_ = 4;
  auVar54._24_4_ = 4;
  auVar54._28_4_ = 4;
  auVar46 = vcmpps_avx(auVar5,auVar73,1);
  auVar46 = vandps_avx(auVar46,auVar54);
  auVar47 = vorps_avx(auVar47,auVar46);
  auVar46 = vcmpps_avx(auVar46,auVar46,0xf);
  local_1260 = vblendvps_avx(auVar46,auVar47,auVar63);
  uVar28 = (ulong)(byte)(SUB161(auVar48 >> 7,0) & 1 | (SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                         (SUB161(auVar48 >> 0x17,0) & 1) << 2 | (SUB161(auVar48 >> 0x1f,0) & 1) << 3
                         | (SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                         (SUB161(auVar48 >> 0x2f,0) & 1) << 5 | (SUB161(auVar48 >> 0x37,0) & 1) << 6
                        | SUB161(auVar48 >> 0x3f,0) << 7);
  local_12c8 = ray;
  local_12c0 = context;
LAB_00f9c6aa:
  lVar4 = 0;
  if (uVar28 != 0) {
    for (; (uVar28 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
    }
  }
  uVar27 = *(undefined4 *)(local_1260 + lVar4 * 4);
  auVar39._4_4_ = uVar27;
  auVar39._0_4_ = uVar27;
  auVar39._8_4_ = uVar27;
  auVar39._12_4_ = uVar27;
  auVar41 = vpcmpeqd_avx(auVar39,local_1260._0_16_);
  auVar39 = vpcmpeqd_avx(auVar39,local_1260._16_16_);
  auVar41 = vpackssdw_avx(auVar41,auVar39);
  auVar39 = vpmovsxwd_avx(auVar41);
  auVar48 = vpunpckhwd_avx(auVar41,auVar41);
  local_1120._16_16_ = auVar48;
  local_1120._0_16_ = auVar39;
  auVar41 = vpacksswb_avx(auVar41,auVar41);
  local_fa0[1] = (ulong)(byte)(SUB161(auVar41 >> 7,0) & 1 | (SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                               (SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                               (SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                               (SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                               (SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                               (SUB161(auVar41 >> 0x37,0) & 1) << 6 | SUB161(auVar41 >> 0x3f,0) << 7
                              );
  local_fa0[0] = *(ulong *)&local_12d8[1].bounds.bounds0.lower.field_0;
  auVar76._8_4_ = 0xff800000;
  auVar76._0_8_ = 0xff800000ff800000;
  auVar76._12_4_ = 0xff800000;
  auVar76._16_4_ = 0xff800000;
  auVar76._20_4_ = 0xff800000;
  auVar76._24_4_ = 0xff800000;
  auVar76._28_4_ = 0xff800000;
  local_12a0 = vblendvps_avx(auVar76,local_1020,local_1120);
  auVar24._8_8_ = uStack_1058;
  auVar24._0_8_ = local_1060;
  auVar24._16_8_ = uStack_1050;
  auVar24._24_8_ = uStack_1048;
  auVar77._8_4_ = 0x7f800000;
  auVar77._0_8_ = 0x7f8000007f800000;
  auVar77._12_4_ = 0x7f800000;
  auVar77._16_4_ = 0x7f800000;
  auVar77._20_4_ = 0x7f800000;
  auVar77._24_4_ = 0x7f800000;
  auVar77._28_4_ = 0x7f800000;
  auVar46 = vblendvps_avx(auVar77,auVar24,local_1120);
  auVar47 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar46 = vminps_avx(auVar46,auVar47);
  auVar47 = vshufpd_avx(auVar46,auVar46,5);
  auVar47 = vminps_avx(auVar46,auVar47);
  auVar22._8_8_ = uStack_1078;
  auVar22._0_8_ = local_1080;
  auVar22._16_8_ = uStack_1070;
  auVar22._24_8_ = uStack_1068;
  auVar46 = vblendvps_avx(auVar77,auVar22,local_1120);
  auVar41 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar47 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar46 = vminps_avx(auVar46,auVar47);
  auVar47 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vminps_avx(auVar46,auVar47);
  auVar39 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar39 = vunpcklps_avx(auVar41,auVar39);
  auVar20._8_8_ = uStack_1098;
  auVar20._0_8_ = local_10a0;
  auVar20._16_8_ = uStack_1090;
  auVar20._24_8_ = uStack_1088;
  auVar46 = vblendvps_avx(auVar77,auVar20,local_1120);
  auVar47 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar46 = vminps_avx(auVar46,auVar47);
  auVar47 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vminps_avx(auVar46,auVar47);
  auVar41 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar48 = vinsertps_avx(auVar39,auVar41,0x28);
  auVar46 = vblendvps_avx(auVar76,auVar24,local_1120);
  auVar47 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar46 = vmaxps_avx(auVar46,auVar47);
  auVar47 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vmaxps_avx(auVar46,auVar47);
  auVar41 = vmaxps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar46 = vblendvps_avx(auVar76,auVar22,local_1120);
  auVar47 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar46 = vmaxps_avx(auVar46,auVar47);
  auVar47 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vmaxps_avx(auVar46,auVar47);
  auVar39 = vmaxps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar39 = vunpcklps_avx(auVar41,auVar39);
  auVar46 = vblendvps_avx(auVar76,auVar20,local_1120);
  auVar47 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar46 = vmaxps_avx(auVar46,auVar47);
  auVar47 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vmaxps_avx(auVar46,auVar47);
  auVar41 = vmaxps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar19._4_4_ = fStack_10bc;
  auVar19._0_4_ = local_10c0;
  auVar19._8_4_ = fStack_10b8;
  auVar19._12_4_ = fStack_10b4;
  auVar19._16_4_ = fStack_10b0;
  auVar19._20_4_ = fStack_10ac;
  auVar19._24_4_ = fStack_10a8;
  auVar19._28_4_ = fStack_10a4;
  auVar46 = vblendvps_avx(auVar77,auVar19,local_1120);
  auVar50 = vinsertps_avx(auVar39,auVar41,0x28);
  auVar47 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar46 = vminps_avx(auVar46,auVar47);
  auVar47 = vshufpd_avx(auVar46,auVar46,5);
  auVar47 = vminps_avx(auVar46,auVar47);
  auVar18._4_4_ = fStack_10dc;
  auVar18._0_4_ = local_10e0;
  auVar18._8_4_ = fStack_10d8;
  auVar18._12_4_ = fStack_10d4;
  auVar18._16_4_ = fStack_10d0;
  auVar18._20_4_ = fStack_10cc;
  auVar18._24_4_ = fStack_10c8;
  auVar18._28_4_ = fStack_10c4;
  auVar46 = vblendvps_avx(auVar77,auVar18,local_1120);
  auVar41 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar47 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar46 = vminps_avx(auVar46,auVar47);
  auVar47 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vminps_avx(auVar46,auVar47);
  auVar39 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar39 = vunpcklps_avx(auVar41,auVar39);
  auVar5._4_4_ = fStack_10fc;
  auVar5._0_4_ = local_1100;
  auVar5._8_4_ = fStack_10f8;
  auVar5._12_4_ = fStack_10f4;
  auVar5._16_4_ = fStack_10f0;
  auVar5._20_4_ = fStack_10ec;
  auVar5._24_4_ = fStack_10e8;
  auVar5._28_4_ = fStack_10e4;
  auVar46 = vblendvps_avx(auVar77,auVar5,local_1120);
  auVar47 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar46 = vminps_avx(auVar46,auVar47);
  auVar47 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vminps_avx(auVar46,auVar47);
  auVar41 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar40 = vinsertps_avx(auVar39,auVar41,0x28);
  auVar46 = vblendvps_avx(auVar76,auVar19,local_1120);
  auVar47 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar46 = vmaxps_avx(auVar46,auVar47);
  auVar47 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vmaxps_avx(auVar46,auVar47);
  auVar41 = vmaxps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar46 = vblendvps_avx(auVar76,auVar18,local_1120);
  auVar47 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar46 = vmaxps_avx(auVar46,auVar47);
  auVar47 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vmaxps_avx(auVar46,auVar47);
  auVar39 = vmaxps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar39 = vunpcklps_avx(auVar41,auVar39);
  auVar46 = vblendvps_avx(auVar76,auVar5,local_1120);
  auVar47 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar46 = vmaxps_avx(auVar46,auVar47);
  auVar47 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vmaxps_avx(auVar46,auVar47);
  auVar41 = vmaxps_avx(auVar46._0_16_,auVar46._16_16_);
  local_fe0 = vblendvps_avx(auVar77,local_1000,local_1120);
  auVar69 = vinsertps_avx(auVar39,auVar41,0x28);
  auVar46 = vshufps_avx(local_fe0,local_fe0,0xb1);
  auVar46 = vminps_avx(local_fe0,auVar46);
  auVar47 = vshufpd_avx(auVar46,auVar46,5);
  auVar47 = vminps_avx(auVar46,auVar47);
  auVar46 = vshufps_avx(local_12a0,local_12a0,0xb1);
  auVar46 = vmaxps_avx(local_12a0,auVar46);
  auVar5 = vshufpd_avx(auVar46,auVar46,5);
  auVar49 = vcmpps_avx(auVar40,_DAT_01f45a50,5);
  auVar41 = vblendvps_avx(auVar69,auVar40,auVar49);
  auVar39 = vblendvps_avx(auVar48,auVar50,auVar49);
  auVar80 = ZEXT1664(auVar39);
  auVar48 = vblendvps_avx(auVar50,auVar48,auVar49);
  auVar46 = vmaxps_avx(auVar46,auVar5);
  auVar50 = vmovshdup_avx(auVar41);
  local_12a8 = (ulong)(auVar50._0_4_ < 0.0) << 4 | 0x20;
  auVar50 = vshufpd_avx(auVar41,auVar41,1);
  uVar38 = (ulong)(auVar50._0_4_ < 0.0) << 4 | 0x40;
  local_12b0 = local_12a8 ^ 0x10;
  local_12d0 = ~local_fa0[1] & uVar28;
  auVar58 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar50 = vmaxps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar49 = vblendvps_avx(auVar40,auVar69,auVar49);
  auVar69._0_4_ = auVar39._0_4_ * auVar41._0_4_;
  auVar69._4_4_ = auVar39._4_4_ * auVar41._4_4_;
  auVar69._8_4_ = auVar39._8_4_ * auVar41._8_4_;
  auVar69._12_4_ = auVar39._12_4_ * auVar41._12_4_;
  auVar40._0_4_ = auVar48._0_4_ * auVar49._0_4_;
  auVar40._4_4_ = auVar48._4_4_ * auVar49._4_4_;
  auVar40._8_4_ = auVar48._8_4_ * auVar49._8_4_;
  auVar40._12_4_ = auVar48._12_4_ * auVar49._12_4_;
  uVar31 = (ulong)(auVar41._0_4_ < 0.0) * 0x10;
  _local_1130 = vshufps_avx(auVar41,auVar41,0);
  local_1140 = vshufps_avx(auVar69,auVar69,0);
  _local_1150 = vshufps_avx(auVar41,auVar41,0x55);
  local_1160 = vshufps_avx(auVar69,auVar69,0x55);
  _local_1170 = vshufps_avx(auVar41,auVar41,0xaa);
  local_1180 = vshufps_avx(auVar69,auVar69,0xaa);
  _local_1190 = vshufps_avx(auVar49,auVar49,0);
  local_11a0 = vshufps_avx(auVar40,auVar40,0);
  _local_11b0 = vshufps_avx(auVar49,auVar49,0x55);
  _local_11c0 = vshufps_avx(auVar49,auVar49,0xaa);
  local_11d0 = vshufps_avx(auVar40,auVar40,0x55);
  local_11e0 = vshufps_avx(auVar40,auVar40,0xaa);
  local_11f0 = vshufps_avx(auVar58,auVar58,0);
  local_1200 = vshufps_avx(auVar50,auVar50,0);
  puVar37 = local_fa0 + 2;
LAB_00f9cad9:
  uVar27 = vmovmskps_avx(local_1300);
  puVar36 = puVar37;
  do {
    if (puVar36 == local_fa0) goto LAB_00f9ced5;
    puVar37 = puVar36 + -2;
    puVar1 = puVar36 + -1;
    puVar36 = puVar37;
    if ((*puVar1 & ~CONCAT44((int)(uVar28 >> 0x20),uVar27)) != 0) {
      uVar34 = 1;
      uVar35 = *puVar37;
      do {
        puVar36 = puVar37;
        if ((uVar35 & 8) != 0) {
          if (uVar34 != 0) {
            local_12b8 = (Primitive *)(uVar35 & 0xfffffffffffffff0);
            local_1240._0_8_ = local_1300._0_8_ ^ 0xffffffffffffffff;
            local_1240._8_4_ = local_1300._8_4_ ^ 0xffffffff;
            local_1240._12_4_ = local_1300._12_4_ ^ 0xffffffff;
            local_1240._16_4_ = local_1300._16_4_ ^ 0xffffffff;
            local_1240._20_4_ = local_1300._20_4_ ^ 0xffffffff;
            local_1240._24_4_ = local_1300._24_4_ ^ 0xffffffff;
            local_1240._28_4_ = local_1300._28_4_ ^ 0xffffffff;
            uVar28 = (ulong)((uint)uVar35 & 0xf) - 7;
            goto LAB_00f9cdf2;
          }
          break;
        }
        pfVar2 = (float *)(uVar35 + 0x20 + uVar31);
        auVar41._0_4_ = (float)local_1130._0_4_ * *pfVar2;
        auVar41._4_4_ = (float)local_1130._4_4_ * pfVar2[1];
        auVar41._8_4_ = fStack_1128 * pfVar2[2];
        auVar41._12_4_ = fStack_1124 * pfVar2[3];
        auVar41 = vsubps_avx(auVar41,local_1140);
        pfVar2 = (float *)(uVar35 + 0x20 + local_12a8);
        auVar48._0_4_ = (float)local_1150._0_4_ * *pfVar2;
        auVar48._4_4_ = (float)local_1150._4_4_ * pfVar2[1];
        auVar48._8_4_ = fStack_1148 * pfVar2[2];
        auVar48._12_4_ = fStack_1144 * pfVar2[3];
        auVar39 = vsubps_avx(auVar48,local_1160);
        auVar41 = vpmaxsd_avx(auVar41,auVar39);
        pfVar2 = (float *)(uVar35 + 0x20 + uVar38);
        auVar49._0_4_ = (float)local_1170._0_4_ * *pfVar2;
        auVar49._4_4_ = (float)local_1170._4_4_ * pfVar2[1];
        auVar49._8_4_ = fStack_1168 * pfVar2[2];
        auVar49._12_4_ = fStack_1164 * pfVar2[3];
        auVar39 = vsubps_avx(auVar49,local_1180);
        auVar39 = vpmaxsd_avx(auVar39,local_11f0);
        auVar41 = vpmaxsd_avx(auVar41,auVar39);
        pfVar2 = (float *)(uVar35 + 0x20 + (uVar31 ^ 0x10));
        auVar50._0_4_ = (float)local_1190._0_4_ * *pfVar2;
        auVar50._4_4_ = (float)local_1190._4_4_ * pfVar2[1];
        auVar50._8_4_ = fStack_1188 * pfVar2[2];
        auVar50._12_4_ = fStack_1184 * pfVar2[3];
        auVar39 = vsubps_avx(auVar50,local_11a0);
        pfVar2 = (float *)(uVar35 + 0x20 + local_12b0);
        auVar58._0_4_ = (float)local_11b0._0_4_ * *pfVar2;
        auVar58._4_4_ = (float)local_11b0._4_4_ * pfVar2[1];
        auVar58._8_4_ = fStack_11a8 * pfVar2[2];
        auVar58._12_4_ = fStack_11a4 * pfVar2[3];
        auVar48 = vsubps_avx(auVar58,local_11d0);
        auVar39 = vpminsd_avx(auVar39,auVar48);
        pfVar2 = (float *)(uVar35 + 0x20 + (uVar38 ^ 0x10));
        auVar59._0_4_ = (float)local_11c0._0_4_ * *pfVar2;
        auVar59._4_4_ = (float)local_11c0._4_4_ * pfVar2[1];
        auVar59._8_4_ = fStack_11b8 * pfVar2[2];
        auVar59._12_4_ = fStack_11b4 * pfVar2[3];
        auVar48 = vsubps_avx(auVar59,local_11e0);
        auVar48 = vpminsd_avx(auVar48,local_1200);
        auVar39 = vpminsd_avx(auVar39,auVar48);
        auVar41 = vcmpps_avx(auVar41,auVar39,2);
        uVar29 = vmovmskps_avx(auVar41);
        if (uVar29 == 0) break;
        uVar30 = (ulong)(uVar29 & 0xff);
        uVar34 = 0;
        uVar32 = 8;
        do {
          lVar4 = 0;
          if (uVar30 != 0) {
            for (; (uVar30 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          uVar3 = *(undefined4 *)(uVar35 + 0x20 + lVar4 * 4);
          auVar42._4_4_ = uVar3;
          auVar42._0_4_ = uVar3;
          auVar42._8_4_ = uVar3;
          auVar42._12_4_ = uVar3;
          auVar42._16_4_ = uVar3;
          auVar42._20_4_ = uVar3;
          auVar42._24_4_ = uVar3;
          auVar42._28_4_ = uVar3;
          auVar25._8_8_ = uStack_1058;
          auVar25._0_8_ = local_1060;
          auVar25._16_8_ = uStack_1050;
          auVar25._24_8_ = uStack_1048;
          auVar46 = vsubps_avx(auVar42,auVar25);
          auVar78._0_4_ = local_10c0 * auVar46._0_4_;
          auVar78._4_4_ = fStack_10bc * auVar46._4_4_;
          auVar78._8_4_ = fStack_10b8 * auVar46._8_4_;
          auVar78._12_4_ = fStack_10b4 * auVar46._12_4_;
          auVar81._16_4_ = fStack_10b0 * auVar46._16_4_;
          auVar81._0_16_ = auVar78;
          auVar81._20_4_ = fStack_10ac * auVar46._20_4_;
          auVar81._28_36_ = auVar80._28_36_;
          auVar81._24_4_ = fStack_10a8 * auVar46._24_4_;
          local_1280 = auVar81._0_32_;
          uVar3 = *(undefined4 *)(uVar35 + 0x40 + lVar4 * 4);
          auVar43._4_4_ = uVar3;
          auVar43._0_4_ = uVar3;
          auVar43._8_4_ = uVar3;
          auVar43._12_4_ = uVar3;
          auVar43._16_4_ = uVar3;
          auVar43._20_4_ = uVar3;
          auVar43._24_4_ = uVar3;
          auVar43._28_4_ = uVar3;
          auVar23._8_8_ = uStack_1078;
          auVar23._0_8_ = local_1080;
          auVar23._16_8_ = uStack_1070;
          auVar23._24_8_ = uStack_1068;
          auVar46 = vsubps_avx(auVar43,auVar23);
          auVar60._0_4_ = local_10e0 * auVar46._0_4_;
          auVar60._4_4_ = fStack_10dc * auVar46._4_4_;
          auVar60._8_4_ = fStack_10d8 * auVar46._8_4_;
          auVar60._12_4_ = fStack_10d4 * auVar46._12_4_;
          auVar61._16_4_ = fStack_10d0 * auVar46._16_4_;
          auVar61._0_16_ = auVar60;
          auVar61._20_4_ = fStack_10cc * auVar46._20_4_;
          auVar61._24_4_ = fStack_10c8 * auVar46._24_4_;
          uVar3 = *(undefined4 *)(uVar35 + 0x60 + lVar4 * 4);
          auVar44._4_4_ = uVar3;
          auVar44._0_4_ = uVar3;
          auVar44._8_4_ = uVar3;
          auVar44._12_4_ = uVar3;
          auVar44._16_4_ = uVar3;
          auVar44._20_4_ = uVar3;
          auVar44._24_4_ = uVar3;
          auVar44._28_4_ = uVar3;
          auVar21._8_8_ = uStack_1098;
          auVar21._0_8_ = local_10a0;
          auVar21._16_8_ = uStack_1090;
          auVar21._24_8_ = uStack_1088;
          auVar46 = vsubps_avx(auVar44,auVar21);
          auVar51._0_4_ = local_1100 * auVar46._0_4_;
          auVar51._4_4_ = fStack_10fc * auVar46._4_4_;
          auVar51._8_4_ = fStack_10f8 * auVar46._8_4_;
          auVar51._12_4_ = fStack_10f4 * auVar46._12_4_;
          auVar52._16_4_ = fStack_10f0 * auVar46._16_4_;
          auVar52._0_16_ = auVar51;
          auVar52._20_4_ = fStack_10ec * auVar46._20_4_;
          auVar52._24_4_ = fStack_10e8 * auVar46._24_4_;
          uVar3 = *(undefined4 *)(uVar35 + 0x30 + lVar4 * 4);
          auVar66._4_4_ = uVar3;
          auVar66._0_4_ = uVar3;
          auVar66._8_4_ = uVar3;
          auVar66._12_4_ = uVar3;
          auVar66._16_4_ = uVar3;
          auVar66._20_4_ = uVar3;
          auVar66._24_4_ = uVar3;
          auVar66._28_4_ = uVar3;
          auVar46 = vsubps_avx(auVar66,auVar25);
          auVar70._0_4_ = local_10c0 * auVar46._0_4_;
          auVar70._4_4_ = fStack_10bc * auVar46._4_4_;
          auVar70._8_4_ = fStack_10b8 * auVar46._8_4_;
          auVar70._12_4_ = fStack_10b4 * auVar46._12_4_;
          auVar15._16_4_ = fStack_10b0 * auVar46._16_4_;
          auVar15._0_16_ = auVar70;
          auVar15._20_4_ = fStack_10ac * auVar46._20_4_;
          auVar15._24_4_ = fStack_10a8 * auVar46._24_4_;
          auVar15._28_4_ = (int)((ulong)uStack_1048 >> 0x20);
          uVar3 = *(undefined4 *)(uVar35 + 0x50 + lVar4 * 4);
          auVar67._4_4_ = uVar3;
          auVar67._0_4_ = uVar3;
          auVar67._8_4_ = uVar3;
          auVar67._12_4_ = uVar3;
          auVar67._16_4_ = uVar3;
          auVar67._20_4_ = uVar3;
          auVar67._24_4_ = uVar3;
          auVar67._28_4_ = uVar3;
          auVar46 = vsubps_avx(auVar67,auVar23);
          auVar71._0_4_ = local_10e0 * auVar46._0_4_;
          auVar71._4_4_ = fStack_10dc * auVar46._4_4_;
          auVar71._8_4_ = fStack_10d8 * auVar46._8_4_;
          auVar71._12_4_ = fStack_10d4 * auVar46._12_4_;
          auVar16._16_4_ = fStack_10d0 * auVar46._16_4_;
          auVar16._0_16_ = auVar71;
          auVar16._20_4_ = fStack_10cc * auVar46._20_4_;
          auVar16._24_4_ = fStack_10c8 * auVar46._24_4_;
          auVar16._28_4_ = (int)((ulong)uStack_1068 >> 0x20);
          uVar3 = *(undefined4 *)(uVar35 + 0x70 + lVar4 * 4);
          auVar68._4_4_ = uVar3;
          auVar68._0_4_ = uVar3;
          auVar68._8_4_ = uVar3;
          auVar68._12_4_ = uVar3;
          auVar68._16_4_ = uVar3;
          auVar68._20_4_ = uVar3;
          auVar68._24_4_ = uVar3;
          auVar68._28_4_ = uVar3;
          auVar46 = vsubps_avx(auVar68,auVar21);
          auVar65._0_4_ = local_1100 * auVar46._0_4_;
          auVar65._4_4_ = fStack_10fc * auVar46._4_4_;
          auVar65._8_4_ = fStack_10f8 * auVar46._8_4_;
          auVar65._12_4_ = fStack_10f4 * auVar46._12_4_;
          auVar17._16_4_ = fStack_10f0 * auVar46._16_4_;
          auVar17._0_16_ = auVar65;
          auVar17._20_4_ = fStack_10ec * auVar46._20_4_;
          auVar17._24_4_ = fStack_10e8 * auVar46._24_4_;
          auVar17._28_4_ = auVar46._28_4_;
          auVar41 = vpminsd_avx(auVar78,auVar70);
          auVar39 = vpminsd_avx(auVar81._16_16_,auVar15._16_16_);
          auVar48 = vpminsd_avx(auVar60,auVar71);
          auVar41 = vpmaxsd_avx(auVar41,auVar48);
          auVar49 = auVar16._16_16_;
          auVar80 = ZEXT1664(auVar49);
          auVar64._12_4_ = 0;
          auVar64._0_12_ = auVar61._16_12_;
          auVar48 = vpminsd_avx(auVar64,auVar49);
          auVar39 = vpmaxsd_avx(auVar39,auVar48);
          auVar57._12_4_ = 0;
          auVar57._0_12_ = auVar52._16_12_;
          auVar48 = vpminsd_avx(auVar57,auVar17._16_16_);
          auVar48 = vpmaxsd_avx(auVar48,local_fe0._16_16_);
          auVar39 = vpmaxsd_avx(auVar39,auVar48);
          auVar48 = vpminsd_avx(auVar51,auVar65);
          auVar48 = vpmaxsd_avx(auVar48,local_fe0._0_16_);
          auVar41 = vpmaxsd_avx(auVar41,auVar48);
          auVar75._16_16_ = auVar39;
          auVar75._0_16_ = auVar41;
          auVar41 = vpmaxsd_avx(auVar70,auVar78);
          auVar39 = vpmaxsd_avx(auVar81._16_16_,auVar15._16_16_);
          auVar48 = vpmaxsd_avx(auVar60,auVar71);
          auVar48 = vpminsd_avx(auVar41,auVar48);
          auVar41 = vpmaxsd_avx(auVar64,auVar49);
          auVar49 = vpminsd_avx(auVar39,auVar41);
          auVar41 = vpmaxsd_avx(auVar57,auVar17._16_16_);
          auVar39 = vpmaxsd_avx(auVar51,auVar65);
          auVar41 = vpminsd_avx(auVar41,local_12a0._16_16_);
          auVar41 = vpminsd_avx(auVar49,auVar41);
          auVar39 = vpminsd_avx(auVar39,local_12a0._0_16_);
          auVar39 = vpminsd_avx(auVar48,auVar39);
          auVar45._16_16_ = auVar41;
          auVar45._0_16_ = auVar39;
          auVar46 = vcmpps_avx(auVar75,auVar45,2);
          uVar33 = uVar32;
          if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar46 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar46 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar46 >> 0x7f,0) != '\0') ||
                (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar46 >> 0xbf,0) != '\0') ||
              (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar46[0x1f] < '\0') {
            uVar33 = *(ulong *)(uVar35 + lVar4 * 8);
            if (uVar32 != 8) {
              *puVar37 = uVar32;
              puVar37[1] = uVar34;
              puVar37 = puVar37 + 2;
            }
            uVar29 = vmovmskps_avx(auVar46);
            uVar34 = (ulong)uVar29;
          }
          uVar30 = uVar30 & uVar30 - 1;
          uVar32 = uVar33;
        } while (uVar30 != 0);
        uVar35 = uVar33;
        puVar36 = puVar37;
      } while (uVar33 != 8);
    }
  } while( true );
  while( true ) {
    local_1280._0_8_ = uVar28;
    auVar80 = ZEXT1664(auVar80._0_16_);
    prim = local_12b8;
    local_12b8 = local_12b8 + 1;
    InstanceIntersectorK<8>::occluded
              ((vbool<8> *)&local_fc0.field_1,(vbool<8> *)&local_1240.field_1,&local_1301,ray,
               local_12c0,prim);
    aVar26 = local_1240;
    local_1240.v = (__m256)vandnps_avx(local_fc0.v,local_1240.v);
    auVar46 = (undefined1  [32])aVar26 & ~(undefined1  [32])local_fc0;
    uVar28 = local_1280._0_8_;
    ray = local_12c8;
    if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar46 >> 0x7f,0) == '\0') &&
          (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar46 >> 0xbf,0) == '\0') &&
        (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar46[0x1f])
    break;
LAB_00f9cdf2:
    uVar28 = uVar28 - 1;
    if (uVar28 == 0) break;
  }
  auVar46._0_8_ = local_1240._0_8_ ^ 0xffffffffffffffff;
  auVar46._8_4_ = local_1240.i[2] ^ 0xffffffff;
  auVar46._12_4_ = local_1240.i[3] ^ 0xffffffff;
  auVar46._16_4_ = local_1240.i[4] ^ 0xffffffff;
  auVar46._20_4_ = local_1240.i[5] ^ 0xffffffff;
  auVar46._24_4_ = local_1240.i[6] ^ 0xffffffff;
  auVar46._28_4_ = local_1240.i[7] ^ 0xffffffff;
  local_1300 = vorps_avx(local_1300,auVar46);
  auVar46 = local_1120 & ~local_1300;
  if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar46 >> 0x7f,0) == '\0') &&
        (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar46 >> 0xbf,0) == '\0') &&
      (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar46[0x1f])
  goto LAB_00f9ced5;
  local_1120 = vandnps_avx(local_1300,local_1120);
  auVar55._8_4_ = 0xff800000;
  auVar55._0_8_ = 0xff800000ff800000;
  auVar55._12_4_ = 0xff800000;
  auVar55._16_4_ = 0xff800000;
  auVar55._20_4_ = 0xff800000;
  auVar55._24_4_ = 0xff800000;
  auVar55._28_4_ = 0xff800000;
  local_12a0 = vblendvps_avx(local_12a0,auVar55,local_1300);
  goto LAB_00f9cad9;
LAB_00f9ced5:
  uVar28 = local_12d0;
  if (local_12d0 == 0) {
    auVar47._0_16_ = local_1040._0_16_;
    auVar47._16_16_ = local_1210;
    auVar46 = vandps_avx(auVar47,local_1300);
    auVar56._8_4_ = 0xff800000;
    auVar56._0_8_ = 0xff800000ff800000;
    auVar56._12_4_ = 0xff800000;
    auVar56._16_4_ = 0xff800000;
    auVar56._20_4_ = 0xff800000;
    auVar56._24_4_ = 0xff800000;
    auVar56._28_4_ = 0xff800000;
    auVar46 = vmaskmovps_avx(auVar46,auVar56);
    *(undefined1 (*) [32])local_12e0 = auVar46;
    return;
  }
  goto LAB_00f9c6aa;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }